

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

bool __thiscall
SGParser::Generator::RegExprDFAParseHandler::Reduce
          (RegExprDFAParseHandler *this,Parse<SGParser::Generator::RegExprDFAParseElement> *parse,
          uint productionID)

{
  pointer *pppRVar1;
  RegExprDataType RVar2;
  Parse<SGParser::Generator::RegExprDFAParseElement> *pPVar3;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 aVar4;
  uint uVar5;
  pointer puVar6;
  RegExprDFANode *pRVar7;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 *paVar8;
  const_iterator cVar9;
  iterator iVar10;
  RegExprDFAParseElement *pRVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar12;
  long *plVar13;
  _Base_ptr p_Var14;
  pointer puVar15;
  long *plVar16;
  long lVar17;
  uint *ord;
  bool bVar18;
  iterator iVar19;
  IndexType IVar20;
  iterator iVar21;
  ulong uVar22;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar23;
  uint uVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  RegExprDFAParseHandler *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  Parse<SGParser::Generator::RegExprDFAParseElement> *local_80;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 local_78;
  string names;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList;
  
  switch(productionID) {
  case 1:
    pRVar7 = (RegExprDFANode *)operator_new(0x80);
    pRVar7->Type = And;
    pRVar7->ID = 0;
    pRVar7->Position = 0;
    (pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7->pParent = (RegExprDFANode *)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    RegExprDFANode::Add(pRVar7,(pRVar11->field_1).pNode);
    IVar20 = 1;
    goto LAB_001439f1;
  case 2:
  case 4:
  case 8:
    break;
  case 3:
    pRVar7 = (RegExprDFANode *)operator_new(0x80);
    pRVar7->Type = Or;
    pRVar7->ID = 0;
    pRVar7->Position = 0;
    (pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7->pParent = (RegExprDFANode *)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    RegExprDFANode::Add(pRVar7,(pRVar11->field_1).pNode);
    IVar20 = 2;
    goto LAB_001439f1;
  case 5:
    pRVar7 = (RegExprDFANode *)operator_new(0x80);
    pRVar7->Type = Star;
    pRVar7->ID = 0;
    goto LAB_00143855;
  case 6:
    pRVar7 = (RegExprDFANode *)operator_new(0x80);
    pRVar7->Type = Plus;
    pRVar7->ID = 0;
    goto LAB_00143855;
  case 7:
    pRVar7 = (RegExprDFANode *)operator_new(0x80);
    pRVar7->Type = Question;
    pRVar7->ID = 0;
LAB_00143855:
    pRVar7->Position = 0;
    (pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar7->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7->pParent = (RegExprDFANode *)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    IVar20 = 0;
LAB_001439f1:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,IVar20);
    RegExprDFANode::Add(pRVar7,(pRVar11->field_1).pNode);
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar11->field_1).pNode = pRVar7;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar11->DataType = Node;
    break;
  case 9:
    goto switchD_001432cd_caseD_9;
  case 10:
    pRVar7 = (RegExprDFANode *)operator_new(0x80);
    uVar5 = this->PositionCount;
    this->PositionCount = uVar5 + 1;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    RegExprDFANode::RegExprDFANode(pRVar7,Char,uVar5,(pRVar11->field_1).ch);
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar11->field_1).pNode = pRVar7;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar11->DataType = Node;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    iVar19._M_current =
         (this->Nodes).
         super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar19._M_current ==
        (this->Nodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
      ::_M_realloc_insert<SGParser::Generator::RegExprDFANode*const&>
                ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                  *)&this->Nodes,iVar19,&(pRVar11->field_1).pNode);
    }
    else {
      *iVar19._M_current = (RegExprDFANode *)*(RegExprDFANode **)&pRVar11->field_1;
      pppRVar1 = &(this->Nodes).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
    break;
  case 0xb:
    names.field_2._8_8_ = 0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&names.field_2 + 8),
               0xfd);
    local_78.ch = 1;
    uVar5 = 1;
    do {
      if (((char)uVar5 != '\n') && ((uVar5 & 0xff) != 0xd)) {
        if (charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (names.field_2._M_local_buf + 8),
                     (iterator)
                     charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_78.ch);
        }
        else {
          *charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = uVar5;
          charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      uVar5 = local_78.ch + 1;
      local_78.ch = uVar5;
    } while (uVar5 < 0x100);
    pRVar7 = (RegExprDFANode *)operator_new(0x80);
    uVar5 = this->PositionCount;
    this->PositionCount = uVar5 + 1;
    pRVar7->Type = Char;
    pRVar7->ID = 0;
    pRVar7->Position = uVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pRVar7->Chars,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&names.field_2 + 8));
    pRVar7->AcceptingState = 0;
    pRVar7->Nullable = false;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7->pParent = (RegExprDFANode *)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar11->field_1).pNode = pRVar7;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar11->DataType = Node;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    iVar19._M_current =
         (this->Nodes).
         super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar19._M_current ==
        (this->Nodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
      ::_M_realloc_insert<SGParser::Generator::RegExprDFANode*const&>
                ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                  *)&this->Nodes,iVar19,&(pRVar11->field_1).pNode);
    }
    else {
      *iVar19._M_current = (RegExprDFANode *)*(RegExprDFANode **)&pRVar11->field_1;
      pppRVar1 = &(this->Nodes).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
    goto LAB_00143d8b;
  case 0xc:
    local_a8 = this;
    local_80 = parse;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    pvVar12 = (pRVar11->field_1).pChars;
    names.field_2._8_8_ = 0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar6 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar15 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (puVar15 != puVar6) {
      uVar22 = 0;
      do {
        uVar5 = puVar6[uVar22];
        local_78.ch = uVar5;
        if (uVar5 <= puVar6[uVar22 + 1]) {
          do {
            if (charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         (names.field_2._M_local_buf + 8),
                         (iterator)
                         charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_78.ch);
              puVar6 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = uVar5;
              charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            uVar5 = local_78.ch + 1;
            local_78.ch = uVar5;
          } while (uVar5 <= puVar6[uVar22 | 1]);
          puVar15 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar22 = uVar22 + 2;
      } while (uVar22 < (ulong)((long)puVar15 - (long)puVar6 >> 2));
    }
    pPVar3 = local_80;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](local_80,1);
    RegExprDFAParseElement::Destroy(pRVar11);
    pRVar7 = (RegExprDFANode *)operator_new(0x80);
    this = local_a8;
    uVar5 = local_a8->PositionCount;
    local_a8->PositionCount = uVar5 + 1;
    pRVar7->Type = Char;
    pRVar7->ID = 0;
    pRVar7->Position = uVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pRVar7->Chars,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&names.field_2 + 8));
    pRVar7->AcceptingState = 0;
    pRVar7->Nullable = false;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7->pParent = (RegExprDFANode *)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](pPVar3,0);
    (pRVar11->field_1).pNode = pRVar7;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](pPVar3,0);
    pRVar11->DataType = Node;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](pPVar3,0);
    paVar8 = &pRVar11->field_1;
    iVar19._M_current =
         (this->Nodes).
         super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar19._M_current ==
        (this->Nodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
      ::_M_realloc_insert<SGParser::Generator::RegExprDFANode*const&>
                ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                  *)&this->Nodes,iVar19,&paVar8->pNode);
    }
    else {
LAB_001435eb:
      *iVar19._M_current = (RegExprDFANode *)*(RegExprDFANode **)paVar8;
      pppRVar1 = &(this->Nodes).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
    goto LAB_00143d8b;
  case 0xd:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    pvVar12 = (pRVar11->field_1).pChars;
    names.field_2._8_8_ = 0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.ch = 1;
    uVar5 = 1;
    do {
      puVar6 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar17 = (long)(pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar6;
      if (lVar17 == 0) {
LAB_0014350f:
        if (charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (names.field_2._M_local_buf + 8),
                     (iterator)
                     charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_78.ch);
        }
        else {
          *charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = uVar5;
          charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      else {
        bVar18 = false;
        uVar22 = 0;
        do {
          for (uVar24 = puVar6[uVar22]; uVar24 <= puVar6[uVar22 + 1]; uVar24 = uVar24 + 1) {
            bVar18 = (bool)(bVar18 | uVar5 == uVar24);
          }
          uVar22 = uVar22 + 2;
        } while (uVar22 < (ulong)(lVar17 >> 2));
        if (!bVar18) goto LAB_0014350f;
      }
      uVar5 = local_78.ch + 1;
      local_78.ch = uVar5;
    } while (uVar5 < 0x100);
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    RegExprDFAParseElement::Destroy(pRVar11);
    pRVar7 = (RegExprDFANode *)operator_new(0x80);
    uVar5 = this->PositionCount;
    this->PositionCount = uVar5 + 1;
    pRVar7->Type = Char;
    pRVar7->ID = 0;
    pRVar7->Position = uVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pRVar7->Chars,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&names.field_2 + 8));
    pRVar7->AcceptingState = 0;
    pRVar7->Nullable = false;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7->pParent = (RegExprDFANode *)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar7->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar11->field_1).pNode = pRVar7;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar11->DataType = Node;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    paVar8 = &pRVar11->field_1;
    iVar19._M_current =
         (this->Nodes).
         super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar19._M_current !=
        (this->Nodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001435eb;
    std::
    vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
    ::_M_realloc_insert<SGParser::Generator::RegExprDFANode*const&>
              ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                *)&this->Nodes,iVar19,&paVar8->pNode);
LAB_00143d8b:
    if (names.field_2._8_8_ != 0) {
      operator_delete((void *)names.field_2._8_8_,
                      (long)charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish - names.field_2._8_8_);
    }
    break;
  case 0xe:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    if ((pRVar11->field_1).pChars == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("parse[1].pChars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x2f1,
                    "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                   );
    }
    names.field_2._8_8_ =
         &charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    std::__cxx11::string::reserve((ulong)((long)&names.field_2 + 8));
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    puVar6 = (((pRVar11->field_1).pChars)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar15 = (((pRVar11->field_1).pChars)->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (puVar6 != puVar15) {
      do {
        std::__cxx11::string::push_back((char)&names + '\x18');
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar15);
    }
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    RegExprDFAParseElement::Destroy(pRVar11);
    pPVar3 = (Parse<SGParser::Generator::RegExprDFAParseElement> *)this->pMacroSyntaxTrees;
    if (pPVar3 == (Parse<SGParser::Generator::RegExprDFAParseElement> *)0x0) {
      __assert_fail("pMacroSyntaxTrees != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x2fc,
                    "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                   );
    }
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                    *)pPVar3,(key_type *)((long)&names.field_2 + 8));
    if ((_Rb_tree_header *)cVar9._M_node == (_Rb_tree_header *)&pPVar3->pTokenizer) {
      local_78.pChars =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&names._M_string_length;
      names._M_dataplus._M_p = (pointer)0x0;
      names._M_string_length._0_1_ = 0;
      p_Var14 = (_Base_ptr)(pPVar3->Stream).pSourceStream;
      local_80 = pPVar3;
      if (p_Var14 != cVar9._M_node) {
        do {
          std::operator+(&local_c8," \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var14 + 1));
          plVar13 = (long *)std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_c8,local_c8._M_string_length,0,'\x01');
          plVar16 = plVar13 + 2;
          if ((long *)*plVar13 == plVar16) {
            local_90 = *plVar16;
            lStack_88 = plVar13[3];
            local_a0 = &local_90;
          }
          else {
            local_90 = *plVar16;
            local_a0 = (long *)*plVar13;
          }
          local_98 = plVar13[1];
          *plVar13 = (long)plVar16;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_78.ch,(ulong)local_a0);
          if (local_a0 != &local_90) {
            operator_delete(local_a0,local_90 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        } while (p_Var14 != cVar9._M_node);
      }
      Lex::CheckForErrorAndReport
                (this->pLex,"Macro \'%s\' not defined; there are %zu known macros:%s",
                 names.field_2._8_8_,(local_80->Stream).pThisBlock,local_78.pChars);
      if (local_78.pChars !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&names._M_string_length) {
        operator_delete(local_78.pChars,
                        CONCAT71(names._M_string_length._1_7_,(undefined1)names._M_string_length) +
                        1);
      }
      bVar18 = true;
    }
    else {
      if (this->pLex == (Lex *)0x0) {
        __assert_fail("pLex != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x30a,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)this->pLex,(key_type *)((long)&names.field_2 + 8));
      if ((_Rb_tree_header *)iVar10._M_node ==
          &(this->pLex->Macros)._M_t._M_impl.super__Rb_tree_header) {
        __assert_fail("pLex->Macros.find(macroName) != pLex->Macros.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x30b,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      lVar17 = *(long *)(cVar9._M_node + 2);
      if (lVar17 == 0) {
        __assert_fail("iter->second",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x30e,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      pvVar12 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(lVar17 + 8);
      if (pvVar12 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        bVar18 = true;
        Lex::CheckForErrorAndReport
                  (this->pLex,"Invalid regular expression in macro \'%s\' used",names.field_2._8_8_)
        ;
      }
      else {
        pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
        (pRVar11->field_1).pChars = pvVar12;
        pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
        pRVar11->DataType = Node;
        std::
        vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<SGParser::Generator::RegExprDFANode**,std::vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>>>
                  ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                    *)&this->Nodes,
                   (this->Nodes).
                   super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar17 + 0x10),
                   *(undefined8 *)(lVar17 + 0x18));
        *(undefined8 *)(lVar17 + 8) = 0;
        bVar18 = false;
      }
    }
    if ((pointer *)names.field_2._8_8_ !=
        &charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)names.field_2._8_8_,
                      (long)charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 1);
    }
    if (bVar18) {
      return false;
    }
    break;
  case 0xf:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    uVar5 = (pRVar11->field_1).ch;
    names.field_2._8_4_ = uVar5;
    pvVar12 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar11->field_1).pChars = pvVar12;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar11->DataType = Chars;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar23 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar11->field_1).pChars;
    iVar21._M_current = *(uint **)(pvVar23 + 8);
    if (iVar21._M_current == *(uint **)(pvVar23 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar23,iVar21,(uint *)(names.field_2._M_local_buf + 8));
    }
    else {
      *iVar21._M_current = uVar5;
      *(uint **)(pvVar23 + 8) = iVar21._M_current + 1;
    }
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar23 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar11->field_1).pChars;
    iVar21._M_current = *(uint **)(pvVar23 + 8);
    if (iVar21._M_current == *(uint **)(pvVar23 + 0x10)) {
LAB_00143d0d:
      paVar8 = (anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 *)
               (names.field_2._M_local_buf + 8);
      goto LAB_00143d50;
    }
    *iVar21._M_current = names.field_2._8_4_;
    goto LAB_00143d3f;
  case 0x10:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    pvVar23 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar11->field_1).pChars;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    iVar21._M_current = *(uint **)(pvVar23 + 8);
    if (iVar21._M_current == *(uint **)(pvVar23 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar23,iVar21,&(pRVar11->field_1).ch);
    }
    else {
      *iVar21._M_current = (pRVar11->field_1).ch;
      *(uint **)(pvVar23 + 8) = iVar21._M_current + 1;
    }
    goto switchD_001432cd_caseD_9;
  case 0x11:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    uVar5 = (pRVar11->field_1).ch;
    names.field_2._8_4_ = uVar5;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    uVar24 = (pRVar11->field_1).ch;
    local_78.ch = uVar24;
    pvVar12 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar11->field_1).pChars = pvVar12;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar11->DataType = Chars;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar23 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar11->field_1).pChars;
    iVar21._M_current = *(uint **)(pvVar23 + 8);
    if (iVar21._M_current == *(uint **)(pvVar23 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar23,iVar21,(uint *)(names.field_2._M_local_buf + 8));
    }
    else {
      *iVar21._M_current = uVar5;
      *(uint **)(pvVar23 + 8) = iVar21._M_current + 1;
    }
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar23 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar11->field_1).pChars;
    iVar21._M_current = *(uint **)(pvVar23 + 8);
    if (iVar21._M_current == *(uint **)(pvVar23 + 0x10)) {
      paVar8 = &local_78;
      goto LAB_00143d50;
    }
    *iVar21._M_current = uVar24;
    goto LAB_00143d3f;
  case 0x12:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    uVar5 = (pRVar11->field_1).ch;
    names.field_2._8_4_ = uVar5;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    uVar24 = (pRVar11->field_1).ch;
    local_78.ch = uVar24;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
    pvVar23 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar11->field_1).pChars;
    iVar21._M_current = *(uint **)(pvVar23 + 8);
    if (iVar21._M_current == *(uint **)(pvVar23 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar23,iVar21,(uint *)(names.field_2._M_local_buf + 8));
    }
    else {
      *iVar21._M_current = uVar5;
      *(uint **)(pvVar23 + 8) = iVar21._M_current + 1;
    }
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
    pvVar23 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar11->field_1).pChars;
    iVar21._M_current = *(uint **)(pvVar23 + 8);
    if (iVar21._M_current == *(uint **)(pvVar23 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar23,iVar21,&local_78.ch);
    }
    else {
      *iVar21._M_current = uVar24;
      *(uint **)(pvVar23 + 8) = iVar21._M_current + 1;
    }
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
    aVar4 = pRVar11->field_1;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar11->field_1 = aVar4;
    IVar20 = 3;
    goto LAB_00143cc8;
  case 0x13:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    uVar5 = (pRVar11->field_1).ch;
    names.field_2._8_4_ = uVar5;
    pvVar12 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar11->field_1).pChars = pvVar12;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar11->DataType = Chars;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar23 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar11->field_1).pChars;
    iVar21._M_current = *(uint **)(pvVar23 + 8);
    if (iVar21._M_current == *(uint **)(pvVar23 + 0x10)) goto LAB_00143d0d;
    *iVar21._M_current = uVar5;
LAB_00143d3f:
    *(uint **)(pvVar23 + 8) = iVar21._M_current + 1;
    break;
  case 0x14:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar23 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar11->field_1).pChars;
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    paVar8 = &pRVar11->field_1;
    iVar21._M_current = *(uint **)(pvVar23 + 8);
    if (iVar21._M_current != *(pointer *)(pvVar23 + 0x10)) {
      *iVar21._M_current = paVar8->ch;
      *(uint **)(pvVar23 + 8) = iVar21._M_current + 1;
      return true;
    }
LAB_00143d50:
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (pvVar23,iVar21,&paVar8->ch);
    break;
  default:
    pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar11->DataType = Null;
  }
  return true;
switchD_001432cd_caseD_9:
  pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
  aVar4 = pRVar11->field_1;
  pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
  pRVar11->field_1 = aVar4;
  IVar20 = 1;
LAB_00143cc8:
  pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,IVar20);
  RVar2 = pRVar11->DataType;
  pRVar11 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
  pRVar11->DataType = RVar2;
  return true;
}

Assistant:

bool Reduce(Parse<RegExprDFAParseElement>& parse, unsigned productionID) override {
        switch (productionID) {
            // RegExp --> RegExp  A
            case RE_RegExpConcat: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::And};
                pnewNode->Add(parse[0].pNode);
                pnewNode->Add(parse[1].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // RegExp --> A
            case RE_RegExp:
                break;

                // A --> A '|' B
            case RE_AOr: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Or};
                pnewNode->Add(parse[0].pNode);
                pnewNode->Add(parse[2].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }
                // A --> B
            case RE_A:
                break;

                // B --> B '*'
            case RE_BStar: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Star};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }
                // B --> B '+'
            case RE_BPlus: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Plus};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // B --> B '?'
            case RE_BQuestion: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Question};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // B --> C
            case RE_B:
                break;

                // C --> '(' RegExp ')'
            case RE_CParen:
                parse[0].pNode    = parse[1].pNode;
                parse[0].DataType = parse[1].DataType;
                break;

                // C --> character
            case RE_CChar:
                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, parse[0].ch};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;

                // C --> '.'
            case RE_CDot: {
                // Construct a list of all characters but '\n'
                std::vector<unsigned> charList;
                charList.reserve(253u);
                for (unsigned k = 1u; k <= 255u; ++k)
                    if (k != '\n' && k != '\r')
                        charList.push_back(k);

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '[' GroupSet ']'
            case RE_CGroupSet: {
                const auto pgroupSet = parse[1].pChars;
                std::vector<unsigned> charList;

                // Construct a list of all the characters represented by the groupSet...
                for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                    for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                        charList.push_back(j);

                // Delete std::vector
                parse[1].Destroy();

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '[' '^' GroupSet ']'
            case RE_CNotGroupSet: {
                // Make a NFA out of the sequence
                const auto pgroupSet = parse[2].pChars;
                std::vector<unsigned> charList;

                // Construct a list of all the characters NOT represented by the groupSet...
                // NOTE: Depends on 0..255 ASCII
                for (unsigned k = 1u; k <= 255u; ++k) {
                    bool f = false;
                    for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                        for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                            if (j == k)
                                f = true;

                    if (!f)
                        charList.push_back(k);
                }
                // Delete std::vector
                parse[2].Destroy();

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '{' CharSet '}'
            case RE_CCharSet: {
                // Generate a string from the char std::vector
                SG_ASSERT(parse[1].pChars);
                String macroName;
                macroName.reserve(parse[1].pChars->size());
                for (auto const& ord : *parse[1].pChars) {
                    macroName.push_back(char(ord));
                }

                // Delete the character std::vector
                parse[1].Destroy();

                // Try to find it in macro list
                SG_ASSERT(pMacroSyntaxTrees != nullptr);
                auto const& map = *pMacroSyntaxTrees;
                auto const& iter = map.find(macroName);
                if (iter == map.end()) {
                    std::string names;
                    for (auto const& [name, _] : map)
                        names += " '" + name + '\'';
                    pLex->CheckForErrorAndReport("Macro '%s' not defined; there are %zu known macros:%s",
                                                 macroName.data(), map.size(), names.data());
                    // Bad!
                    return false;
                }

                // Invariant: macroName should also be in pLex->Macros:
                SG_ASSERT(pLex != nullptr);
                SG_ASSERT(pLex->Macros.find(macroName) != pLex->Macros.end());

                // Get the macro node from the Macros list
                SG_ASSERT(iter->second);
                auto& macroTree = *iter->second;

                if (!macroTree.pRoot) {
                    pLex->CheckForErrorAndReport("Invalid regular expression in macro '%s' used",
                                                 macroName.data());
                    // Bad!
                    return false;
                }

                // Change all the character positions
                parse[0].pNode    = macroTree.pRoot;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                // Take care of nodes
                Nodes.insert(Nodes.end(), macroTree.CharNodes.begin(), macroTree.CharNodes.end());

                // clear the temporary tree
                macroTree.pRoot = nullptr;
                break;
            }

            // GroupSet --> character
            case RE_GroupSetChar: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;

                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                parse[0].pChars->push_back(code);
                break;
            }

                // GroupSet --> character GroupSet
            case RE_GroupSetCharGroupSet:
                // Add the char to the end of the CharSet std::vector
                parse[1].pChars->push_back(parse[0].ch);
                parse[0].pChars   = parse[1].pChars;
                parse[0].DataType = parse[1].DataType;
                break;

                // GroupSet --> character '-' character
            case RE_GroupSetCharList: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                parse[0].pChars->push_back(code2);
                break;
            }

                // GroupSet --> character '-' character GroupSet
            case RE_GroupSetCharListGroupSet: {
                // Add the char to the end of the CharSet std::vector
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[3].pChars->push_back(code);
                parse[3].pChars->push_back(code2);
                parse[0].pChars   = parse[3].pChars;
                parse[0].DataType = parse[3].DataType;
                break;
            }

                // CharSet --> character
            case RE_CharSet: {
                // Get the code and add it to the new std::vector
                const auto code   = parse[0].ch;
                // Create a new std::vector of chars
                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                break;
            }

                // CharSet --> CharSet character
            case RE_CharSetChar:
                // Add the char to the end of the CharSet std::vector
                parse[0].pChars->push_back(parse[1].ch);
                break;

            default:
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Null;
                break;
        }

        return true;
    }